

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O1

int run_test_fork_signal_to_child(void)

{
  int iVar1;
  uint __pid;
  __pid_t __pid_00;
  undefined8 uVar2;
  ssize_t sVar3;
  ulong unaff_RBX;
  char sync_buf [1];
  int sync_pipe [2];
  uv_signal_t signal_handle;
  undefined1 uStack_169;
  int iStack_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  undefined1 auStack_158 [152];
  code *pcStack_c0;
  undefined1 local_a9;
  int local_a8;
  int local_a4;
  undefined1 local_a0 [152];
  
  fork_signal_cb_called = 0;
  pcStack_c0 = (code *)0x157d58;
  iVar1 = pipe(&local_a8);
  if (iVar1 == 0) {
    pcStack_c0 = (code *)0x157d65;
    run_timer_loop_once();
    pcStack_c0 = (code *)0x157d6a;
    uVar2 = uv_default_loop();
    pcStack_c0 = (code *)0x157d77;
    iVar1 = uv_signal_init(uVar2,local_a0);
    if (iVar1 != 0) goto LAB_00157efd;
    pcStack_c0 = (code *)0x157d95;
    iVar1 = uv_signal_start(local_a0,fork_signal_to_child_cb,10);
    if (iVar1 != 0) goto LAB_00157f02;
    pcStack_c0 = (code *)0x157da2;
    __pid = fork();
    if (__pid != 0) {
      unaff_RBX = (ulong)__pid;
      if (__pid == 0xffffffff) goto LAB_00157f0c;
      pcStack_c0 = (code *)0x157dc8;
      sVar3 = read(local_a8,&local_a9,1);
      if (sVar3 != 1) goto LAB_00157f11;
      pcStack_c0 = (code *)0x157dde;
      iVar1 = kill(__pid,10);
      if (iVar1 != 0) goto LAB_00157f1b;
      pcStack_c0 = (code *)0x157df2;
      puts("Running loop in parent");
      pcStack_c0 = (code *)0x157dfc;
      uv_unref(local_a0);
      pcStack_c0 = (code *)0x157e01;
      uVar2 = uv_default_loop();
      pcStack_c0 = (code *)0x157e0e;
      iVar1 = uv_run(uVar2,2);
      if (iVar1 != 0) goto LAB_00157f25;
      if (fork_signal_cb_called == 0) {
        pcStack_c0 = (code *)0x157e2f;
        puts("Waiting for child in parent");
        pcStack_c0 = (code *)0x157e36;
        assert_wait_child(__pid);
LAB_00157eb4:
        pcStack_c0 = (code *)0x157eb9;
        unaff_RBX = uv_default_loop();
        pcStack_c0 = (code *)0x157ecd;
        uv_walk(unaff_RBX,close_walk_cb,0);
        pcStack_c0 = (code *)0x157ed7;
        uv_run(unaff_RBX,0);
        pcStack_c0 = (code *)0x157edc;
        uVar2 = uv_default_loop();
        pcStack_c0 = (code *)0x157ee4;
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          pcStack_c0 = (code *)0x157eed;
          uv_library_shutdown();
          return 0;
        }
        goto LAB_00157f07;
      }
      goto LAB_00157f2f;
    }
    pcStack_c0 = (code *)0x157e3d;
    uVar2 = uv_default_loop();
    pcStack_c0 = (code *)0x157e45;
    iVar1 = uv_loop_fork(uVar2);
    if (iVar1 != 0) goto LAB_00157f16;
    pcStack_c0 = (code *)0x157e62;
    sVar3 = write(local_a4,"1",1);
    if (sVar3 != 1) goto LAB_00157f20;
    pcStack_c0 = (code *)0x157e71;
    uVar2 = uv_default_loop();
    pcStack_c0 = (code *)0x157e79;
    iVar1 = uv_loop_alive(uVar2);
    if (iVar1 == 0) goto LAB_00157f2a;
    pcStack_c0 = (code *)0x157e8d;
    puts("Running loop in child");
    pcStack_c0 = (code *)0x157e92;
    uVar2 = uv_default_loop();
    pcStack_c0 = (code *)0x157e9f;
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00157f34;
    if (fork_signal_cb_called == 10) goto LAB_00157eb4;
  }
  else {
    pcStack_c0 = (code *)0x157efd;
    run_test_fork_signal_to_child_cold_1();
LAB_00157efd:
    pcStack_c0 = (code *)0x157f02;
    run_test_fork_signal_to_child_cold_2();
LAB_00157f02:
    pcStack_c0 = (code *)0x157f07;
    run_test_fork_signal_to_child_cold_3();
LAB_00157f07:
    pcStack_c0 = (code *)0x157f0c;
    run_test_fork_signal_to_child_cold_14();
LAB_00157f0c:
    pcStack_c0 = (code *)0x157f11;
    run_test_fork_signal_to_child_cold_9();
LAB_00157f11:
    pcStack_c0 = (code *)0x157f16;
    run_test_fork_signal_to_child_cold_10();
LAB_00157f16:
    pcStack_c0 = (code *)0x157f1b;
    run_test_fork_signal_to_child_cold_4();
LAB_00157f1b:
    pcStack_c0 = (code *)0x157f20;
    run_test_fork_signal_to_child_cold_11();
LAB_00157f20:
    pcStack_c0 = (code *)0x157f25;
    run_test_fork_signal_to_child_cold_5();
LAB_00157f25:
    pcStack_c0 = (code *)0x157f2a;
    run_test_fork_signal_to_child_cold_12();
LAB_00157f2a:
    pcStack_c0 = (code *)0x157f2f;
    run_test_fork_signal_to_child_cold_8();
LAB_00157f2f:
    pcStack_c0 = (code *)0x157f34;
    run_test_fork_signal_to_child_cold_13();
LAB_00157f34:
    pcStack_c0 = (code *)0x157f39;
    run_test_fork_signal_to_child_cold_6();
  }
  pcStack_c0 = run_test_fork_signal_to_child_closed;
  run_test_fork_signal_to_child_cold_7();
  fork_signal_cb_called = 0;
  pcStack_c0 = (code *)unaff_RBX;
  iVar1 = pipe(&iStack_160);
  if (iVar1 == 0) {
    iVar1 = pipe(&iStack_168);
    if (iVar1 != 0) goto LAB_001580e3;
    run_timer_loop_once();
    uVar2 = uv_default_loop();
    iVar1 = uv_signal_init(uVar2,auStack_158);
    if (iVar1 != 0) goto LAB_001580e8;
    iVar1 = uv_signal_start(auStack_158,fork_signal_to_child_cb,10);
    if (iVar1 != 0) goto LAB_001580ed;
    __pid_00 = fork();
    if (__pid_00 == 0) goto LAB_001580f2;
    if (__pid_00 == -1) goto LAB_00158125;
    puts("Wating on child in parent");
    sVar3 = read(iStack_160,&uStack_169,1);
    if (sVar3 != 1) goto LAB_0015812a;
    puts("Parent killing child");
    iVar1 = kill(__pid_00,10);
    if (iVar1 != 0) goto LAB_0015812f;
    puts("Running loop in parent");
    uv_unref(auStack_158);
    run_timer_loop_once();
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00158134;
    printf("Signal in parent %d\n",(ulong)(uint)fork_signal_cb_called);
    if (fork_signal_cb_called != 0) goto LAB_00158139;
    sVar3 = write(iStack_164,"1",1);
    if (sVar3 != 1) goto LAB_0015813e;
    puts("Waiting for child in parent");
    assert_wait_child(__pid_00);
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
LAB_00158143:
    run_test_fork_signal_to_child_closed_cold_16();
LAB_00158148:
    run_test_fork_signal_to_child_closed_cold_5();
  }
  else {
    run_test_fork_signal_to_child_closed_cold_1();
LAB_001580e3:
    run_test_fork_signal_to_child_closed_cold_2();
LAB_001580e8:
    run_test_fork_signal_to_child_closed_cold_3();
LAB_001580ed:
    run_test_fork_signal_to_child_closed_cold_4();
LAB_001580f2:
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_fork(uVar2);
    if (iVar1 != 0) goto LAB_00158148;
    puts("Checking loop in child");
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_alive(uVar2);
    if (iVar1 == 0) {
      run_test_fork_signal_to_child_closed_cold_9();
LAB_00158125:
      run_test_fork_signal_to_child_closed_cold_10();
LAB_0015812a:
      run_test_fork_signal_to_child_closed_cold_11();
LAB_0015812f:
      run_test_fork_signal_to_child_closed_cold_12();
LAB_00158134:
      run_test_fork_signal_to_child_closed_cold_13();
LAB_00158139:
      run_test_fork_signal_to_child_closed_cold_14();
LAB_0015813e:
      run_test_fork_signal_to_child_closed_cold_15();
      goto LAB_00158143;
    }
  }
  puts("Alerting parent in child");
  sVar3 = write(iStack_15c,"1",1);
  if (sVar3 == 1) {
    puts("Waiting on parent in child");
    sVar3 = read(iStack_168,&uStack_169,1);
    if ((int)sVar3 + 1U < 3) {
      if (fork_signal_cb_called == 0) {
        puts("Exiting child ");
        exit(0);
      }
      goto LAB_001581c0;
    }
  }
  else {
    run_test_fork_signal_to_child_closed_cold_6();
  }
  run_test_fork_signal_to_child_closed_cold_7();
LAB_001581c0:
  run_test_fork_signal_to_child_closed_cold_8();
  _do_fork_fs_events_child(0);
  return 0;
}

Assistant:

TEST_IMPL(fork_signal_to_child) {
  /* A signal handler installed before forking
     is run only in the child when the child is signalled. */
  uv_signal_t signal_handle;
  pid_t child_pid;
  int sync_pipe[2];
  char sync_buf[1];

  fork_signal_cb_called = 0;    /* reset */

  ASSERT(0 == pipe(sync_pipe));

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == uv_signal_init(uv_default_loop(), &signal_handle));
  ASSERT(0 == uv_signal_start(&signal_handle, fork_signal_to_child_cb, SIGUSR1));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    ASSERT(1 == read(sync_pipe[0], sync_buf, 1)); /* wait for child */
    ASSERT(0 == kill(child_pid, SIGUSR1));
    /* Run the loop, make sure we don't get the signal. */
    printf("Running loop in parent\n");
    uv_unref((uv_handle_t*)&signal_handle);
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_NOWAIT));
    ASSERT(0 == fork_signal_cb_called);
    printf("Waiting for child in parent\n");
    assert_wait_child(child_pid);
  } else {
    /* child */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    ASSERT(1 == write(sync_pipe[1], "1", 1)); /* alert parent */
    /* Get the signal. */
    ASSERT(0 != uv_loop_alive(uv_default_loop()));
    printf("Running loop in child\n");
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));
    ASSERT(SIGUSR1 == fork_signal_cb_called);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}